

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Segment::UpdateDocTypeVersion(Segment *this)

{
  Track **ppTVar1;
  ulong uVar2;
  ulong uVar3;
  Track *pTVar4;
  
  uVar2 = (ulong)(this->tracks_).track_entries_size_;
  if (uVar2 != 0) {
    ppTVar1 = (this->tracks_).track_entries_;
    uVar3 = 0;
    do {
      if (ppTVar1 == (Track **)0x0) {
        pTVar4 = (Track *)0x0;
      }
      else {
        pTVar4 = ppTVar1[uVar3];
      }
      if (pTVar4 == (Track *)0x0) {
        return;
      }
      if (pTVar4->codec_delay_ == 0) {
        if (pTVar4->seek_pre_roll_ != 0 && this->doc_type_version_ < 4) goto LAB_00855233;
      }
      else if (this->doc_type_version_ < 4) {
LAB_00855233:
        this->doc_type_version_ = 4;
        return;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void Segment::UpdateDocTypeVersion() {
  for (uint32_t index = 0; index < tracks_.track_entries_size(); ++index) {
    const Track* track = tracks_.GetTrackByIndex(index);
    if (track == NULL)
      break;
    if ((track->codec_delay() || track->seek_pre_roll()) &&
        doc_type_version_ < 4) {
      doc_type_version_ = 4;
      break;
    }
  }
}